

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesNode.cpp
# Opt level: O1

void __thiscall chrono::ChVariablesNode::ArchiveOUT(ChVariablesNode *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChVariablesNode>(marchive);
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  return;
}

Assistant:

void ChVariablesNode::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChVariablesNode>();
    // serialize parent class
    ChVariables::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(mass);
}